

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddRuneRangeLatin1(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  int in_EDX;
  int in_ESI;
  Compiler *in_RDI;
  Compiler *unaff_retaddr;
  int in_stack_ffffffffffffffdc;
  
  if ((in_ESI <= in_EDX) && (in_ESI < 0x100)) {
    UncachedRuneByteSuffix
              (unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),(uint8_t)((ulong)in_RDI >> 0x30),
               SUB81((ulong)in_RDI >> 0x28,0),(int)in_RDI);
    AddSuffix(in_RDI,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void Compiler::AddRuneRangeLatin1(Rune lo, Rune hi, bool foldcase) {
  // Latin-1 is easy: runes *are* bytes.
  if (lo > hi || lo > 0xFF)
    return;
  if (hi > 0xFF)
    hi = 0xFF;
  AddSuffix(UncachedRuneByteSuffix(static_cast<uint8_t>(lo),
                                   static_cast<uint8_t>(hi), foldcase, 0));
}